

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.h
# Opt level: O2

void __thiscall free_format_parser::HMpsFF::~HMpsFF(HMpsFF *this)

{
  std::__cxx11::string::~string((string *)&this->section_args);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->colname2idx)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->rowname2idx)._M_h);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->cone_entries);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->cone_param).super__Vector_base<double,_std::allocator<double>_>);
  std::
  _Vector_base<free_format_parser::HMpsFF::ConeType,_std::allocator<free_format_parser::HMpsFF::ConeType>_>
  ::~_Vector_base(&(this->cone_type).
                   super__Vector_base<free_format_parser::HMpsFF::ConeType,_std::allocator<free_format_parser::HMpsFF::ConeType>_>
                 );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->cone_name);
  std::
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::~vector(&this->sos_entries);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            (&(this->sos_type).super__Vector_base<short,_std::allocator<short>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->sos_name);
  std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~_Vector_base
            (&(this->coeffobj).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
  std::
  vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
  ::~vector(&this->qrows_entries);
  std::_Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
  ~_Vector_base(&(this->q_entries).
                 super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
               );
  std::_Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
  ~_Vector_base(&(this->entries).
                 super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
               );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->integer_column).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
  ::~_Vector_base(&(this->row_type).
                   super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
                 );
  std::__cxx11::string::~string((string *)&this->objective_name);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->has_row_entry_).super__Bvector_base<std::allocator<bool>_>);
  std::__cxx11::string::~string((string *)&this->duplicate_col_name_);
  std::__cxx11::string::~string((string *)&this->duplicate_row_name_);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->col_binary).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->q_value).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->q_index).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->q_start).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<HighsVarType,_std::allocator<HighsVarType>_>::~_Vector_base
            (&(this->col_integrality).
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->col_names);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->row_names);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->row_upper).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->row_lower).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->col_upper).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->col_lower).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->col_cost).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->a_value).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->a_index).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->a_start).super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&this->mps_name);
  return;
}

Assistant:

HMpsFF() {}